

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::MLsyncProject
          (Projection *this,int c_lev,MultiFab *pres_crse,MultiFab *vel_crse,MultiFab *cc_rhs_crse,
          MultiFab *pres_fine,MultiFab *vel_fine,MultiFab *cc_rhs_fine,MultiFab *rho_crse,
          MultiFab *rho_fine,MultiFab *Vsync,MultiFab *V_corr,MultiFab *phi_fine,
          SyncRegister *rhs_sync_reg,SyncRegister *crsr_sync_reg,Real dt_crse,IntVect *ratio,
          int crse_iteration,int crse_dt_ratio,Geometry *crse_geom)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  pointer pMVar4;
  allocator_type *val;
  MultiFab **ppMVar5;
  AmrLevel **ppAVar6;
  MultiFab *vel_00;
  Print *this_00;
  uint uVar7;
  FabArrayBase *in_RDX;
  int in_ESI;
  SyncRegister *in_RDI;
  MultiFab *in_R8;
  FabArrayBase *in_R9;
  MultiFab *in_stack_00000010;
  Projection *in_stack_00000018;
  MultiFab *in_stack_00000020;
  MultiFab *in_stack_00000028;
  MultiFab *in_stack_00000030;
  int *in_stack_00000050;
  int in_stack_00000058;
  int in_stack_00000060;
  Geometry *in_stack_00000068;
  Real run_time;
  int IOProc;
  BoxArray sync_boxes;
  Geometry *crsr_geom;
  Real invrat;
  bool increment_gp;
  int ngrow;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> sync_resid_fine;
  MultiFab *sync_resid_crse;
  NavierStokesBase *ns;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> rhnd_vec;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> rhcc;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> sig;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel;
  Box P_finedomain;
  MultiFab rhnd;
  DistributionMapping *Pdmap_fine;
  DistributionMapping *Pdmap_crse;
  BoxArray *Pgrids_fine;
  BoxArray *Pgrids_crse;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  phi;
  Real strt_time;
  IntVect shft;
  int i;
  char (*in_stack_fffffffffffff408) [39];
  BoxArray *rhs;
  AmrLevel *in_stack_fffffffffffff410;
  Print *this_01;
  undefined4 in_stack_fffffffffffff418;
  int in_stack_fffffffffffff41c;
  NavierStokesBase *in_stack_fffffffffffff420;
  undefined8 uVar8;
  undefined4 in_stack_fffffffffffff430;
  int in_stack_fffffffffffff434;
  ostream *in_stack_fffffffffffff438;
  Print *in_stack_fffffffffffff440;
  BoxArray *in_stack_fffffffffffff448;
  MultiFab *in_stack_fffffffffffff450;
  BoxArray *in_stack_fffffffffffff458;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff460;
  Print *in_stack_fffffffffffff480;
  undefined8 in_stack_fffffffffffff550;
  int iVar9;
  MultiFab *in_stack_fffffffffffff558;
  undefined8 in_stack_fffffffffffff560;
  int iVar10;
  MultiFab *in_stack_fffffffffffff568;
  Projection *in_stack_fffffffffffff570;
  bool local_a31;
  Print *in_stack_fffffffffffff648;
  Print *in_stack_fffffffffffff650;
  Print *in_stack_fffffffffffff658;
  Geometry *in_stack_fffffffffffff660;
  Print *in_stack_fffffffffffff668;
  double local_7f8;
  int local_7ec;
  Geometry *local_780;
  double local_778;
  byte local_752;
  undefined1 local_751;
  _func_int **local_750;
  BATransformer local_748;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6f8;
  pointer local_6d0;
  BoxArray local_6c8;
  Box local_660;
  Box local_644;
  MultiArray4<double> local_628;
  MultiArray4<const_double> MStack_620;
  pointer local_618;
  pointer pbStack_610;
  pointer local_608;
  undefined1 in_stack_fffffffffffffa1e;
  undefined1 in_stack_fffffffffffffa1f;
  undefined8 in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  undefined8 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  element_type *in_stack_fffffffffffffa50;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffaf0;
  DataAllocator in_stack_fffffffffffffaf8;
  MultiFab *in_stack_fffffffffffffb08;
  MultiFab *in_stack_fffffffffffffb10;
  Geometry local_3c0 [2];
  FabArrayBase *local_230;
  MultiFab *local_228;
  FabArrayBase *local_218;
  int local_20c;
  Box *local_200;
  int local_1f8 [2];
  int local_1f0;
  int local_1e8;
  int iStack_1e4;
  int local_1e0;
  IntVect local_1dc;
  int *local_1d0;
  Box *local_1c8;
  int *local_1c0;
  IntVect *local_1b8;
  int *local_1b0;
  Box *local_1a8;
  undefined4 local_19c;
  int *local_198;
  undefined4 local_18c;
  int *local_188;
  undefined4 local_17c;
  int *local_178;
  undefined4 local_16c;
  int *local_168;
  undefined4 local_15c;
  int *local_158;
  undefined4 local_14c;
  int *local_148;
  int local_13c;
  Box *local_138;
  int local_12c;
  IndexType *local_128;
  undefined4 local_120;
  int local_11c;
  IntVect *local_118;
  IndexType *local_110;
  int local_104;
  IndexType *local_100;
  int local_f8;
  undefined4 local_f4;
  int local_e8 [2];
  int local_e0;
  IndexType *local_d8;
  IntVect local_cc;
  IntVect *local_c0;
  IntVect *local_b8;
  undefined4 local_ac;
  IntVect *local_a8;
  undefined4 local_9c;
  IntVect *local_98;
  undefined4 local_8c;
  IntVect *local_88;
  int *local_80;
  IntVect *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  IntVect *local_40;
  IntVect *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  Geometry *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  SyncRegister *in_stack_fffffffffffffff8;
  
  iVar10 = (int)((ulong)in_stack_fffffffffffff560 >> 0x20);
  iVar9 = (int)((ulong)in_stack_fffffffffffff550 >> 0x20);
  local_230 = in_R9;
  local_228 = in_R8;
  local_218 = in_RDX;
  local_20c = in_ESI;
  if (verbose != 0) {
    amrex::OutStream();
    in_stack_fffffffffffff660 = local_3c0;
    amrex::Print::Print(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
    in_stack_fffffffffffff668 =
         amrex::Print::operator<<((Print *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    in_stack_fffffffffffff658 =
         amrex::Print::operator<<
                   ((Print *)in_stack_fffffffffffff410,(int *)in_stack_fffffffffffff408);
    in_stack_fffffffffffff650 =
         amrex::Print::operator<<
                   ((Print *)in_stack_fffffffffffff410,(char (*) [3])in_stack_fffffffffffff408);
    in_stack_fffffffffffff648 =
         amrex::Print::operator<<
                   ((Print *)in_stack_fffffffffffff410,(int *)in_stack_fffffffffffff408);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff410,*in_stack_fffffffffffff408);
    amrex::Print::~Print(in_stack_fffffffffffff480);
  }
  if ((verbose != 0) && (((anonymous_namespace)::benchmarking & 1) != 0)) {
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  dVar1 = amrex::ParallelDescriptor::second();
  std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>::
  allocator((allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_> *)
            0x58eaee);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            *)in_stack_fffffffffffff410,(size_type)in_stack_fffffffffffff408,
           (allocator_type *)0x58eb08);
  std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>::
  ~allocator((allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_> *)
             0x58eb17);
  amrex::FabArrayBase::boxArray(local_218);
  amrex::FabArrayBase::boxArray(local_230);
  amrex::FabArrayBase::DistributionMap(local_218);
  amrex::FabArrayBase::DistributionMap(local_230);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff410,(size_type)in_stack_fffffffffffff408);
  operator_new(0x180);
  amrex::MFInfo::MFInfo((MFInfo *)0x58ebf8);
  amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
            ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
             in_stack_fffffffffffff410,(size_type)in_stack_fffffffffffff408);
  pMVar4 = (pointer)amrex::AmrLevel::Factory(in_stack_fffffffffffff410);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448,
             (DistributionMapping *)in_stack_fffffffffffff440,
             (int)((ulong)in_stack_fffffffffffff438 >> 0x20),(int)in_stack_fffffffffffff438,
             (MFInfo *)CONCAT44(in_stack_fffffffffffff434,in_stack_fffffffffffff430),
             in_stack_fffffffffffff460);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffff410,pMVar4);
  amrex::MFInfo::~MFInfo((MFInfo *)0x58ec7c);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff410,(size_type)pMVar4);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x58ec99);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff410,(value_type)pMVar4);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff410,(size_type)pMVar4);
  operator_new(0x180);
  amrex::MFInfo::MFInfo((MFInfo *)0x58ed37);
  amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
            ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
             in_stack_fffffffffffff410,(size_type)pMVar4);
  pMVar4 = (pointer)amrex::AmrLevel::Factory(in_stack_fffffffffffff410);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448,
             (DistributionMapping *)in_stack_fffffffffffff440,
             (int)((ulong)in_stack_fffffffffffff438 >> 0x20),(int)in_stack_fffffffffffff438,
             (MFInfo *)CONCAT44(in_stack_fffffffffffff434,in_stack_fffffffffffff430),
             in_stack_fffffffffffff460);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffff410,pMVar4);
  amrex::MFInfo::~MFInfo((MFInfo *)0x58edbf);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff410,(size_type)pMVar4);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x58ede0);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff410,(value_type)pMVar4);
  local_618 = (pointer)0x0;
  pbStack_610 = (pointer)0x0;
  local_628.hp = (Array4<double> *)0x0;
  MStack_620.hp = (Array4<const_double> *)0x0;
  local_608 = (pointer)0x0;
  amrex::MFInfo::MFInfo((MFInfo *)0x58ee41);
  amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
            ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
             in_stack_fffffffffffff410,(size_type)pMVar4);
  val = (allocator_type *)amrex::AmrLevel::Factory(in_stack_fffffffffffff410);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448,
             (DistributionMapping *)in_stack_fffffffffffff440,
             (int)((ulong)in_stack_fffffffffffff438 >> 0x20),(int)in_stack_fffffffffffff438,
             (MFInfo *)CONCAT44(in_stack_fffffffffffff434,in_stack_fffffffffffff430),
             in_stack_fffffffffffff460);
  amrex::MFInfo::~MFInfo((MFInfo *)0x58eea7);
  SyncRegister::InitRHS
            (in_stack_fffffffffffffff8,
             (MultiFab *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8,
             (BCRec *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  local_200 = amrex::Geometry::Domain(in_stack_00000068);
  local_644.smallend.vect._0_8_ = *(undefined8 *)(local_200->smallend).vect;
  local_644._8_8_ = *(undefined8 *)((local_200->smallend).vect + 2);
  local_644.bigend.vect._4_8_ = *(undefined8 *)((local_200->bigend).vect + 1);
  uVar7 = (local_200->btype).itype;
  local_138 = &local_644;
  for (local_13c = 0; local_13c < 3; local_13c = local_13c + 1) {
    local_128 = &local_644.btype;
    local_12c = local_13c;
    local_104 = local_13c;
    local_f8 = local_13c;
    if ((uVar7 & 1 << ((byte)local_13c & 0x1f)) == 0) {
      local_118 = &local_644.bigend;
      local_11c = local_13c;
      local_120 = 1;
      local_118->vect[local_13c] = local_118->vect[local_13c] + 1;
    }
    local_100 = local_128;
  }
  local_110 = &local_644.btype;
  local_644.btype.itype = 7;
  local_1d0 = in_stack_00000050;
  local_f4 = 1;
  local_a31 = true;
  if ((*in_stack_00000050 == 1) && (local_a31 = true, in_stack_00000050[1] == 1)) {
    local_a31 = in_stack_00000050[2] != 1;
  }
  local_1c8 = &local_644;
  if (local_a31) {
    amrex::IntVect::IntVect(&local_1dc,1);
    local_d8 = &local_644.btype;
    amrex::IntVect::IntVect
              (&local_cc,local_644.btype.itype & 1,local_644.btype.itype >> 1 & 1,
               local_644.btype.itype >> 2 & 1);
    local_e0 = local_cc.vect[2];
    local_e8[0] = local_cc.vect[0];
    local_e8[1] = local_cc.vect[1];
    local_1f0 = local_cc.vect[2];
    local_1f8[0] = local_cc.vect[0];
    local_1f8[1] = local_cc.vect[1];
    local_1e8 = local_cc.vect[0];
    iStack_1e4 = local_cc.vect[1];
    uVar8 = _local_1e8;
    local_1e0 = local_cc.vect[2];
    local_78 = &local_1dc;
    local_80 = &local_1e8;
    local_4c = 0;
    local_1e8 = local_cc.vect[0];
    local_1dc.vect[0] = local_1dc.vect[0] - local_1e8;
    local_5c = 1;
    iStack_1e4 = local_cc.vect[1];
    local_1dc.vect[1] = local_1dc.vect[1] - iStack_1e4;
    local_6c = 2;
    local_1dc.vect[2] = local_1dc.vect[2] - local_cc.vect[2];
    local_1b0 = local_1d0;
    local_178 = local_1d0;
    local_17c = 0;
    iVar3 = local_644.smallend.vect[1];
    local_644.smallend.vect[0] = *local_1d0 * local_644.smallend.vect[0];
    local_188 = local_1d0;
    local_18c = 1;
    local_644.smallend.vect[1] = local_1d0[1] * iVar3;
    local_198 = local_1d0;
    local_19c = 2;
    iVar3 = local_644.bigend.vect[0];
    local_644.smallend.vect[2] = local_1d0[2] * local_644.smallend.vect[2];
    local_38 = &local_644.bigend;
    local_40 = &local_1dc;
    local_644.bigend.vect[0] = local_1dc.vect[0] + iVar3;
    iVar3 = local_644.bigend.vect[2];
    local_644.bigend.vect[1] = local_1dc.vect[1] + local_644.bigend.vect[1];
    local_2c = 2;
    local_644.bigend.vect[2] = local_1dc.vect[2] + iVar3;
    local_1b8 = &local_644.bigend;
    local_1c0 = local_1d0;
    local_148 = local_1d0;
    local_14c = 0;
    local_644.bigend.vect[0] = *local_1d0 * local_644.bigend.vect[0];
    local_158 = local_1d0;
    local_15c = 1;
    iVar3 = local_644.bigend.vect[2];
    local_644.bigend.vect[1] = local_1d0[1] * local_644.bigend.vect[1];
    local_168 = local_1d0;
    local_16c = 2;
    local_644.bigend.vect[2] = local_1d0[2] * iVar3;
    local_b8 = &local_644.bigend;
    local_c0 = &local_1dc;
    local_8c = 0;
    local_644.bigend.vect[0] = local_644.bigend.vect[0] - local_1dc.vect[0];
    local_9c = 1;
    iVar3 = local_644.bigend.vect[2];
    local_644.bigend.vect[1] = local_644.bigend.vect[1] - local_1dc.vect[1];
    local_ac = 2;
    local_644.bigend.vect[2] = iVar3 - local_1dc.vect[2];
    _local_1e8 = uVar8;
    local_1a8 = &local_644;
    local_a8 = local_c0;
    local_98 = local_c0;
    local_88 = local_c0;
    local_68 = local_80;
    local_58 = local_80;
    local_48 = local_80;
    local_28 = local_40;
  }
  amrex::BoxArray::operator[]((BoxArray *)in_stack_fffffffffffff420,in_stack_fffffffffffff41c);
  bVar2 = amrex::Box::operator==(&local_660,&local_644);
  if (bVar2) {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff410,(value_type)val);
  }
  scaleVar(in_stack_fffffffffffff570,in_stack_fffffffffffff568,iVar10,in_stack_fffffffffffff558,
           iVar9);
  scaleVar(in_stack_fffffffffffff570,in_stack_fffffffffffff568,iVar10,in_stack_fffffffffffff558,
           iVar9);
  bVar2 = amrex::CoordSys::IsRZ(&in_stack_00000068->super_CoordSys);
  if (bVar2) {
    radMultScal((Projection *)in_RDI,local_20c,local_228);
    radMultScal((Projection *)in_RDI,local_20c + 1,in_stack_00000010);
  }
  local_6c8.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (BARef *)0x0
  ;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x58f7a3);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff420,CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418)
             ,(value_type *)in_stack_fffffffffffff410,val);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x58f7d4);
  local_6c8.m_bat.m_op._28_8_ = (_Bit_type *)0x0;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x58f7f5);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff420,CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418)
             ,(value_type *)in_stack_fffffffffffff410,val);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x58f826);
  local_6d0 = (pointer)0x0;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x58f847);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff420,CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418)
             ,(value_type *)in_stack_fffffffffffff410,val);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x58f878);
  local_6f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x58f899);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff420,CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418)
             ,(value_type *)in_stack_fffffffffffff410,val);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x58f8ca);
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  *ppMVar5 = in_stack_00000028;
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  iVar9 = (int)((ulong)in_stack_00000028 >> 0x20);
  *ppMVar5 = in_stack_00000030;
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  *ppMVar5 = (MultiFab *)in_stack_00000018;
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  *ppMVar5 = in_stack_00000020;
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  *ppMVar5 = local_228;
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  *ppMVar5 = in_stack_00000010;
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  *ppMVar5 = (MultiFab *)&stack0xfffffffffffffa00;
  ppAVar6 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  if (*ppAVar6 == (AmrLevel *)0x0) {
    vel_00 = (MultiFab *)0x0;
  }
  else {
    vel_00 = (MultiFab *)
             __dynamic_cast(*ppAVar6,&amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo,0);
  }
  local_748.m_op._60_8_ = vel_00;
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  iVar10 = (int)((ulong)*ppMVar5 >> 0x20);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff410,(size_type)val);
  NavierStokesBase::average_down
            (in_stack_fffffffffffff420,
             (MultiFab *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             (MultiFab *)in_stack_fffffffffffff410,(int)((ulong)val >> 0x20),(int)val);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff410,(size_type)val);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff410,(size_type)val);
  ppMVar5 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff410,(size_type)val);
  amrex::FabArrayBase::nComp((FabArrayBase *)*ppMVar5);
  NavierStokesBase::average_down
            (in_stack_fffffffffffff420,
             (MultiFab *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             (MultiFab *)in_stack_fffffffffffff410,(int)((ulong)val >> 0x20),(int)val);
  local_748.m_op._52_8_ = (MultiFab *)0x0;
  std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
  unique_ptr<std::default_delete<amrex::MultiFab>,void>
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffff410);
  if ((0 < local_20c) && (in_stack_00000058 == in_stack_00000060)) {
    iVar3 = amrex::AmrMesh::MaxRefRatio
                      ((AmrMesh *)in_stack_fffffffffffff420,in_stack_fffffffffffff41c);
    local_748.m_op.m_bndryReg.m_hishft.vect[2] = iVar3 + -1;
    operator_new(0x180);
    local_751 = 1;
    local_748.m_op._12_8_ = 0;
    local_748.m_op._20_8_ = 0;
    local_748._0_8_ = 0;
    local_748.m_op._4_8_ = 0;
    local_748.m_op._28_8_ = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x58fd12);
    local_750 = (_func_int **)0x0;
    pMVar4 = (pointer)&local_750;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff410);
    amrex::MultiFab::MultiFab
              (in_stack_fffffffffffff450,in_stack_fffffffffffff448,
               (DistributionMapping *)in_stack_fffffffffffff440,
               (int)((ulong)in_stack_fffffffffffff438 >> 0x20),(int)in_stack_fffffffffffff438,
               (MFInfo *)CONCAT44(in_stack_fffffffffffff434,in_stack_fffffffffffff430),
               in_stack_fffffffffffff460);
    local_751 = 0;
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff410,pMVar4);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x58fda7);
    amrex::MFInfo::~MFInfo((MFInfo *)0x58fdb4);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x58fdc1);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff410,(value_type)pMVar4);
  }
  local_752 = 1;
  amrex::GetVecOfPtrs<amrex::MultiFab>
            ((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              *)in_stack_fffffffffffff458);
  uVar8 = local_748.m_op._52_8_;
  uVar7 = (uint)local_752;
  pMVar4 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                     ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                      in_stack_fffffffffffff410);
  uVar7 = uVar7 & 1;
  this_01 = (Print *)&stack0xfffffffffffff910;
  rhs = &local_6c8;
  iVar3 = 0;
  doMLMGNodalProjection
            ((Projection *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
             in_stack_fffffffffffffa48,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffffa40,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffffa38,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffffa30,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffffaf0._M_head_impl,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffffaf8.m_arena,(Real)in_stack_fffffffffffffa28,
             (Real)in_stack_fffffffffffffa20,(bool)in_stack_fffffffffffffa1f,
             in_stack_fffffffffffffb08,in_stack_fffffffffffffb10,(bool)in_stack_fffffffffffffa1e);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x58ff64);
  if ((0 < local_20c) && (in_stack_00000058 == in_stack_00000060)) {
    local_778 = 1.0 / (double)in_stack_00000060;
    local_780 = amrex::AmrMesh::Geom((AmrMesh *)this_01,(int)((ulong)rhs >> 0x20));
    amrex::FabArrayBase::boxArray(local_230);
    amrex::BoxArray::BoxArray((BoxArray *)this_01,rhs);
    amrex::BoxArray::coarsen(in_stack_fffffffffffff458,(IntVect *)in_stack_fffffffffffff450);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_01);
    SyncRegister::CompAdd
              (in_RDI,(MultiFab *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (Geometry *)in_stack_fffffffffffff658,(BoxArray *)in_stack_fffffffffffff650,
               (Real)in_stack_fffffffffffff648);
    amrex::BoxArray::~BoxArray((BoxArray *)this_01);
  }
  rescaleVar(in_stack_00000018,in_stack_00000030,iVar9,vel_00,iVar10);
  rescaleVar(in_stack_00000018,in_stack_00000030,iVar9,vel_00,iVar10);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)this_01,(size_type)rhs);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_01);
  amrex::MultiFab::Copy
            ((MultiFab *)in_stack_fffffffffffff440,(MultiFab *)in_stack_fffffffffffff438,
             in_stack_fffffffffffff434,iVar3,(int)((ulong)pMVar4 >> 0x20),(int)pMVar4);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)this_01,(size_type)rhs);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_01);
  amrex::FabArrayBase::nGrow(local_218,0);
  amrex::MultiFab::Add
            ((MultiFab *)uVar8,(MultiFab *)CONCAT44(in_stack_fffffffffffff41c,uVar7),
             (int)((ulong)this_01 >> 0x20),(int)this_01,(int)((ulong)rhs >> 0x20),(int)rhs);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)this_01,(size_type)rhs);
  this_00 = (Print *)std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::
                     operator*((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *
                               )this_01);
  amrex::FabArrayBase::nGrow(local_230,0);
  amrex::MultiFab::Add
            ((MultiFab *)uVar8,(MultiFab *)CONCAT44(in_stack_fffffffffffff41c,uVar7),
             (int)((ulong)this_01 >> 0x20),(int)this_01,(int)((ulong)rhs >> 0x20),(int)rhs);
  amrex::MultiFab::Saxpy
            (in_stack_fffffffffffff450,(Real)in_stack_fffffffffffff448,
             (MultiFab *)in_stack_fffffffffffff440,(int)((ulong)in_stack_fffffffffffff438 >> 0x20),
             (int)in_stack_fffffffffffff438,in_stack_fffffffffffff434,iVar3);
  amrex::MultiFab::Saxpy
            (in_stack_fffffffffffff450,(Real)in_stack_fffffffffffff448,
             (MultiFab *)in_stack_fffffffffffff440,(int)((ulong)in_stack_fffffffffffff438 >> 0x20),
             (int)in_stack_fffffffffffff438,in_stack_fffffffffffff434,iVar3);
  if (verbose != 0) {
    local_7ec = amrex::ParallelDescriptor::IOProcessorNumber();
    local_7f8 = amrex::ParallelDescriptor::second();
    local_7f8 = local_7f8 - dVar1;
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_7f8,local_7ec);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
    amrex::Print::operator<<(this_01,(char (*) [39])rhs);
    amrex::Print::operator<<(this_01,(int *)rhs);
    amrex::Print::operator<<(this_01,(char (*) [3])rhs);
    amrex::Print::operator<<(this_01,(int *)rhs);
    amrex::Print::operator<<(this_01,(char (*) [9])rhs);
    amrex::Print::operator<<(this_01,(double *)rhs);
    amrex::Print::operator<<(this_01,(char *)rhs);
    amrex::Print::~Print(this_00);
  }
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_01);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x59041f);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x59042c);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x590439);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x590446);
  amrex::MultiFab::~MultiFab((MultiFab *)0x590453);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~Vector((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             *)0x590460);
  return;
}

Assistant:

void
Projection::MLsyncProject (int             c_lev,
                           MultiFab&       pres_crse,
                           MultiFab&       vel_crse,
                           MultiFab&       cc_rhs_crse,
                           MultiFab&       pres_fine,
                           MultiFab&       vel_fine,
                           MultiFab&       cc_rhs_fine,
                           MultiFab&       rho_crse,
                           MultiFab&       rho_fine,
                           MultiFab&       Vsync,
                           MultiFab&       V_corr,
                           MultiFab&       phi_fine,
                           SyncRegister*   rhs_sync_reg,
                           SyncRegister*   crsr_sync_reg,
                           Real            dt_crse,
                           IntVect&        ratio,
                           int             crse_iteration,
                           int             crse_dt_ratio,
                           const Geometry& crse_geom)
{
    BL_PROFILE("Projection::MLsyncProject()");

    if (verbose) {
      amrex::Print() << "Projection::MLsyncProject(): levels = " << c_lev << ", " << c_lev+1 << '\n';
    }

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real strt_time = ParallelDescriptor::second();

    //
    // Set up memory.
    //
    Vector<std::unique_ptr<MultiFab> > phi(maxlev);

    const BoxArray& Pgrids_crse = pres_crse.boxArray();
    const BoxArray& Pgrids_fine = pres_fine.boxArray();
    const DistributionMapping& Pdmap_crse = pres_crse.DistributionMap();
    const DistributionMapping& Pdmap_fine = pres_fine.DistributionMap();

    phi[c_lev].reset(new MultiFab(Pgrids_crse,Pdmap_crse,1,1,MFInfo(),LevelData[c_lev]->Factory()));
    phi[c_lev]->setVal(0);

    phi[c_lev+1].reset(new MultiFab(Pgrids_fine,Pdmap_fine,1,1,MFInfo(),LevelData[c_lev+1]->Factory()));
    phi[c_lev+1]->setVal(0);

    //
    // Set up crse RHS
    //
    MultiFab rhnd(Pgrids_crse,Pdmap_crse,1,0,MFInfo(),LevelData[c_lev]->Factory());
    rhs_sync_reg->InitRHS(rhnd,crse_geom,*phys_bc);

    Box P_finedomain(amrex::surroundingNodes(crse_geom.Domain()));
    P_finedomain.refine(ratio);
    if (Pgrids_fine[0] == P_finedomain) {
        rhnd.setVal(0);
    }
    //
    // Do necessary scaling
    //
    scaleVar(&rho_crse, 0, &Vsync,   c_lev  );
    scaleVar(&rho_fine, 0, &V_corr, c_lev+1);

    if (crse_geom.IsRZ()) {
       radMultScal(c_lev  ,cc_rhs_crse);
       radMultScal(c_lev+1,cc_rhs_fine);
    }

    Vector<MultiFab*> vel (maxlev, nullptr);
    Vector<MultiFab*> sig (maxlev, nullptr);
    Vector<MultiFab*> rhcc(maxlev, nullptr);
    Vector<MultiFab*> rhnd_vec(maxlev, nullptr);

    vel[c_lev  ] = &Vsync;
    vel[c_lev+1] = &V_corr;
    sig[c_lev  ] = &rho_crse;
    sig[c_lev+1] = &rho_fine;
    rhcc[c_lev  ] = &cc_rhs_crse;
    rhcc[c_lev+1] = &cc_rhs_fine;
    rhnd_vec[c_lev] = &rhnd;

    NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[c_lev]);
    ns->average_down(*vel[c_lev+1],*vel[c_lev],0,AMREX_SPACEDIM);

    ns->average_down(*sig[c_lev+1],*sig[c_lev],0,sig[c_lev]->nComp());

    MultiFab* sync_resid_crse = 0;
    std::unique_ptr<MultiFab> sync_resid_fine;

    if (c_lev > 0 &&  crse_iteration == crse_dt_ratio)
    {
        int ngrow = parent->MaxRefRatio(c_lev-1) - 1;
        sync_resid_fine.reset(new MultiFab(Pgrids_crse,Pdmap_crse,1,ngrow));
        sync_resid_fine->setVal(0.);
    }

    bool increment_gp = true;
    doMLMGNodalProjection(c_lev, 2, vel,
                          amrex::GetVecOfPtrs(phi),
                          sig, rhcc, rhnd_vec, sync_tol, proj_abs_tol, increment_gp,
                          sync_resid_crse, sync_resid_fine.get());

    //
    // If this sync project is not at levels 0-1 then we need to account for
    // the changes made here in the level c_lev velocity in the sync registers
    // going into the level (c_lev-1) sync project.  Note that this must be
    // done before rho_half is scaled back.
    //
    if (c_lev > 0 && crse_iteration == crse_dt_ratio)
    {
        const Real invrat         = 1.0/Real(crse_dt_ratio);
        const Geometry& crsr_geom = parent->Geom(c_lev-1);
        BoxArray sync_boxes       = pres_fine.boxArray();
        sync_boxes.coarsen(ratio);
        crsr_sync_reg->CompAdd(*sync_resid_fine,crse_geom,crsr_geom,sync_boxes,invrat);
    }
    //
    // Do necessary un-scaling.
    //
    rescaleVar(&rho_crse, 0, &Vsync,   c_lev  );
    rescaleVar(&rho_fine, 0, &V_corr, c_lev+1);

    MultiFab::Copy(phi_fine, *phi[c_lev+1], 0, 0, 1, 1);

    //
    // Add phi to pressure.
    // Only update the most recent pressure.
    //
    MultiFab::Add(pres_crse,*phi[c_lev],0,0,1,pres_crse.nGrow());
    MultiFab::Add(pres_fine,*phi[c_lev+1],0,0,1,pres_fine.nGrow());
    //
    // Grad(P_new) incremented in doMLMGNodalProjection
    //

    //
    // Add projected vel to new velocity.
    //
    MultiFab::Saxpy(vel_crse,dt_crse,Vsync,0,0,AMREX_SPACEDIM,1);
    MultiFab::Saxpy(vel_fine,dt_crse,V_corr,0,0,AMREX_SPACEDIM,1);

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

	amrex::Print() << "Projection::MLsyncProject(): levels = " << c_lev
		       << ", " << c_lev+1 << ", time: " << run_time << '\n';
    }
}